

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerIteration.cpp
# Opt level: O0

EigenAnswer * RealValues(EigenAnswer *__return_storage_ptr__,Vector *x1,Vector *x2)

{
  double dVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  double *pdVar5;
  double local_40;
  int local_34;
  double dStack_30;
  int i;
  double value;
  Vector *ans;
  Vector *x2_local;
  Vector *x1_local;
  
  dStack_30 = 0.0;
  local_34 = 0;
  value = (double)x2;
  ans = x2;
  x2_local = x1;
  x1_local = &__return_storage_ptr__->vector;
  for (; uVar2 = (ulong)local_34,
      sVar3 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)value), uVar2 < sVar3;
      local_34 = local_34 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](x2_local,(long)local_34);
    if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](ans,(long)local_34);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](x2_local,(long)local_34);
      local_40 = dVar1 / *pvVar4;
      pdVar5 = std::max<double>(&stack0xffffffffffffffd0,&local_40);
      dStack_30 = *pdVar5;
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->vector,(vector<double,_std::allocator<double>_> *)value);
  __return_storage_ptr__->value = dStack_30;
  return __return_storage_ptr__;
}

Assistant:

EigenAnswer RealValues(const Vector &x1, const Vector &x2)
{
    const Vector &ans = x2;
    double value = 0;

    // average?
    for (int i = 0; i < ans.size(); ++i)
    {
        if (x1[i] != 0)
        {
            value = std::max(value, x2[i] / x1[i]);
        }
    }

    return {.vector = ans, .value = value};
}